

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_19ea3::TestStreamingLongWritesCorrectCharacters::RunImpl
          (TestStreamingLongWritesCorrectCharacters *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  char *actual;
  TestDetails **ppTVar2;
  TestDetails local_1d8;
  undefined1 local_1a8 [8];
  MemoryOutStream stream;
  TestStreamingLongWritesCorrectCharacters *this_local;
  
  stream._400_8_ = this;
  UnitTest::MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1a8);
  std::ostream::operator<<((MemoryOutStream *)local_1a8,-0x7b);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  actual = UnitTest::MemoryOutStream::GetText((MemoryOutStream *)local_1a8);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1d8,*ppTVar2,0x32);
  UnitTest::CheckEqual(results,"-123",actual,&local_1d8);
  UnitTest::MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1a8);
  return;
}

Assistant:

TEST(StreamingLongWritesCorrectCharacters)
{
    MemoryOutStream stream;
    stream << (long)(-123);
    CHECK_EQUAL("-123", stream.GetText());
}